

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O1

Blob * jbcoin::generatePublicDeterministicKey(Blob *__return_storage_ptr__,Blob *pubGen,int seq)

{
  uchar *s;
  BN_CTX *c;
  bn_ctx ctx;
  ec_point newPoint;
  bignum hash;
  ec_point rootPubKey;
  bignum local_40;
  ec_point local_38;
  bignum local_30;
  ec_point local_28;
  
  s = (pubGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start;
  local_40.ptr = (BIGNUM *)
                 BN_bin2bn(s,*(int *)&(pubGen->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (int)s,
                           (BIGNUM *)0x0);
  if ((BIGNUM *)local_40.ptr == (BIGNUM *)0x0) {
    Throw<std::runtime_error,char_const(&)[19]>((char (*) [19])"BN_bin2bn() failed");
  }
  openssl::bn2point((openssl *)&local_28,openssl::secp256k1curve,local_40.ptr);
  openssl::bignum::~bignum(&local_40);
  c = BN_CTX_new();
  local_40.ptr = (BIGNUM *)c;
  if (c != (BN_CTX *)0x0) {
    makeHash((Blob *)&local_30,(int)pubGen,(bignum *)(ulong)(uint)seq);
    openssl::multiply((openssl *)&local_38,openssl::secp256k1curve,&local_30,(bn_ctx *)&local_40);
    openssl::add_to(openssl::secp256k1curve,&local_28,&local_38,(bn_ctx *)&local_40);
    serialize_ec_point(__return_storage_ptr__,&local_38);
    EC_POINT_free((EC_POINT *)local_38.ptr);
    openssl::bignum::~bignum(&local_30);
    BN_CTX_free(c);
    EC_POINT_free((EC_POINT *)local_28.ptr);
    return __return_storage_ptr__;
  }
  Throw<std::runtime_error,char_const(&)[20]>((char (*) [20])"BN_CTX_new() failed");
}

Assistant:

Blob generatePublicDeterministicKey (Blob const& pubGen, int seq)
{
    // publicKey(n) = rootPublicKey EC_POINT_+ Hash(pubHash|seq)*point
    ec_point rootPubKey = generateRootPubKey (bignum (pubGen));

    bn_ctx ctx;

    // Calculate the private additional key.
    bignum hash = makeHash (pubGen, seq, secp256k1curve.order);

    // Calculate the corresponding public key.
    ec_point newPoint = multiply (secp256k1curve.group, hash, ctx);

    // Add the master public key and set.
    add_to (secp256k1curve.group, rootPubKey, newPoint, ctx);

    return serialize_ec_point (newPoint);
}